

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O0

bool __thiscall cmDocumentation::PrintRequestedDocumentation(cmDocumentation *this,ostream *os)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  ulong uVar4;
  ostream *local_248;
  ostream *s;
  ofstream fout;
  RequestedHelpItem *rhi;
  iterator __end1;
  iterator __begin1;
  vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
  *__range1;
  bool result;
  int count;
  ostream *os_local;
  cmDocumentation *this_local;
  
  __range1._4_4_ = 0;
  __range1._3_1_ = true;
  __end1 = std::
           vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
           ::begin(&this->RequestedHelpItems);
  rhi = (RequestedHelpItem *)
        std::
        vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
        ::end(&this->RequestedHelpItems);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmDocumentation::RequestedHelpItem_*,_std::vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>_>
                                     *)&rhi), bVar1) {
    fout._504_8_ = __gnu_cxx::
                   __normal_iterator<cmDocumentation::RequestedHelpItem_*,_std::vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>_>
                   ::operator*(&__end1);
    std::__cxx11::string::operator=
              ((string *)&this->CurrentArgument,(string *)&((reference)fout._504_8_)->Argument);
    std::ofstream::ofstream(&s);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      _Var3 = std::__cxx11::string::c_str();
      std::ofstream::open((char *)&s,_Var3);
      local_248 = (ostream *)&s;
    }
    else {
      __range1._4_4_ = __range1._4_4_ + 1;
      local_248 = os;
      if (1 < __range1._4_4_) {
        std::operator<<(os,"\n\n");
      }
    }
    bVar1 = PrintDocumentation(this,*(Type *)fout._504_8_,local_248);
    if ((!bVar1) || (bVar2 = std::ios::fail(), (bVar2 & 1) != 0)) {
      __range1._3_1_ = false;
    }
    std::ofstream::~ofstream(&s);
    __gnu_cxx::
    __normal_iterator<cmDocumentation::RequestedHelpItem_*,_std::vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>_>
    ::operator++(&__end1);
  }
  return __range1._3_1_;
}

Assistant:

bool cmDocumentation::PrintRequestedDocumentation(std::ostream& os)
{
  int count = 0;
  bool result = true;

  // Loop over requested documentation types.
  for (RequestedHelpItem const& rhi : this->RequestedHelpItems) {
    this->CurrentArgument = rhi.Argument;
    // If a file name was given, use it.  Otherwise, default to the
    // given stream.
    cmsys::ofstream fout;
    std::ostream* s = &os;
    if (!rhi.Filename.empty()) {
      fout.open(rhi.Filename.c_str());
      s = &fout;
    } else if (++count > 1) {
      os << "\n\n";
    }

    // Print this documentation type to the stream.
    if (!this->PrintDocumentation(rhi.HelpType, *s) || s->fail()) {
      result = false;
    }
  }
  return result;
}